

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> * __thiscall
Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>::operator=
          (OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *this,
          OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *other)

{
  long *plVar1;
  Value VVar2;
  bool bVar3;
  int iVar4;
  
  if ((this->_isSome == true) && (VVar2 = (this->_elem)._elem, VVar2 != (Value)0x0)) {
    plVar1 = (long *)((long)VVar2 + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)VVar2 + 8))();
    }
  }
  bVar3 = other->_isSome;
  if (bVar3 == true) {
    VVar2 = (other->_elem)._elem;
    if (VVar2 == (Value)0x0) {
      (this->_elem)._elem = (Value)0x0;
    }
    else {
      iVar4 = *(int *)((long)VVar2 + 8);
      (this->_elem)._elem = VVar2;
      iVar4 = iVar4 + 1;
      *(int *)((long)VVar2 + 8) = iVar4;
      if (iVar4 == 0) {
        (**(code **)(*(long *)VVar2 + 8))();
        bVar3 = other->_isSome;
      }
    }
  }
  this->_isSome = bVar3;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }